

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preferences.cpp
# Opt level: O2

int __thiscall
f8n::prefs::Preferences::GetString
          (Preferences *this,char *key,char *dst,size_t size,char *defaultValue)

{
  long lVar1;
  string value;
  allocator<char> local_82;
  allocator<char> local_81;
  string local_80 [8];
  int local_78;
  string local_60 [32];
  string local_40 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_40,key,&local_81);
  std::__cxx11::string::string<std::allocator<char>>(local_60,defaultValue,&local_82);
  (*(this->super_IPreferences)._vptr_IPreferences[0xd])(local_80,this,local_40,local_60);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  if (dst != (char *)0x0) {
    lVar1 = std::__cxx11::string::copy((char *)local_80,(ulong)dst,size - 1);
    local_78 = (int)lVar1;
    dst[lVar1] = '\0';
  }
  std::__cxx11::string::~string(local_80);
  return local_78 + 1;
}

Assistant:

int Preferences::GetString(const char* key, char* dst, size_t size, const char* defaultValue) {
    std::string value = this->GetString(std::string(key), defaultValue);
    return str::copy(value, dst, size);
}